

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<int>::set_size(RepeatedField<int> *this,bool is_soo,int size)

{
  string *psVar1;
  int v2;
  undefined7 in_register_00000031;
  LogMessageFatal aLStack_28 [16];
  
  if ((int)CONCAT71(in_register_00000031,is_soo) == 0) {
    v2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  else {
    v2 = 2;
  }
  psVar1 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                     (size,v2,"size <= Capacity(is_soo)");
  if (psVar1 == (string *)0x0) {
    internal::SooRep::set_size(&this->soo_rep_,is_soo,size);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,0x1e9,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_28);
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_LE(size, Capacity(is_soo));
    soo_rep_.set_size(is_soo, size);
  }